

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_std::time_put_from_base<char>::do_put
          (time_put_from_base<char> *this,iter_type out,ios_base *param_2,char fill,tm *tm,
          char format,char modifier)

{
  undefined1 auVar1 [12];
  time_put *ptVar2;
  iter_type iVar3;
  locale local_1c0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ios::imbue(&local_1c0);
  std::locale::~locale(&local_1c0);
  ptVar2 = std::use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                     (&this->base_);
  auVar1 = (**(code **)(*(long *)ptVar2 + 0x10))
                     (ptVar2,out._M_sbuf,out._8_4_ & 0xff,
                      (stringstream *)&ss + *(long *)(_ss + -0x18),(int)fill,tm,(int)format,
                      (int)modifier);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
  iVar3._12_4_ = 0;
  iVar3._M_sbuf = (streambuf_type *)auVar1._0_8_;
  iVar3._M_failed = (bool)auVar1[8];
  iVar3._9_3_ = auVar1._9_3_;
  return iVar3;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType fill,std::tm const *tm,char format,char modifier) const
    {
        std::basic_stringstream<CharType> ss;
        ss.imbue(base_);
        return std::use_facet<std::time_put<CharType> >(base_).put(out,ss,fill,tm,format,modifier);
    }